

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall clask::server_t::static_dir(server_t *this,string *path,string *dir,bool listing)

{
  anon_class_72_3_b8803698 local_d0;
  func_t local_88;
  byte local_21;
  string *psStack_20;
  bool listing_local;
  string *dir_local;
  string *path_local;
  server_t *this_local;
  
  local_21 = listing;
  psStack_20 = dir;
  dir_local = path;
  path_local = &this->compiled_tree;
  std::__cxx11::string::string((string *)&local_d0,(string *)path);
  std::__cxx11::string::string((string *)&local_d0.dir,(string *)psStack_20);
  local_d0.listing = (bool)(local_21 & 1);
  std::function<void(clask::response_writer&,clask::request&)>::
  function<clask::server_t::static_dir(std::__cxx11::string_const&,std::__cxx11::string_const&,bool)::_lambda(clask::response_writer&,clask::request&)_1_,void>
            ((function<void(clask::response_writer&,clask::request&)> *)&local_88,&local_d0);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
  ::function(&local_88.f_string);
  std::function<clask::response_(clask::request_&)>::function(&local_88.f_response);
  parse_tree(this,&this->treeGET,path,&local_88);
  _func_t::~_func_t(&local_88);
  static_dir(std::__cxx11::string_const&,std::__cxx11::string_const&,bool)::
  {lambda(clask::response_writer&,clask::request&)#1}::~request
            ((_lambda_clask__response_writer__clask__request___1_ *)&local_d0);
  return;
}

Assistant:

inline void server_t::static_dir(const std::string& path, const std::string& dir, bool listing) {
  parse_tree(treeGET, path, func_t {
    .f_writer = [path, dir, listing](response_writer& resp, request& req) {
      std::vector<std::string> paths;
      std::string p = req.uri;
      while (true) {
        auto pos = p.find('/', 1);
        if (pos == std::string::npos) {
          auto sub = p.substr(1);
          if (sub == "..") paths.pop_back();
          else paths.emplace_back(sub);
          break;
        } else {
          auto sub = p.substr(1, pos - 1);
          if (sub == "..") paths.pop_back();
          else paths.emplace_back(sub);
        }
        p = p.substr(pos);
      }
      std::ostringstream os;
      for (auto it = paths.begin(); it != paths.end(); ++it) {
        if (it != paths.end()) os << "/";
        os << *it;
      }
      auto req_path = os.str();
      auto res = std::mismatch(req_path.begin(), req_path.end(), path.begin());
      if (res.first == path.end()) {
        resp.code = 404;
        resp.set_header("content-type", "text/plain");
        resp.write("Not Found");
        return;
      }
      req_path = url_decode(req_path.substr(path.size()));
      req_path = dir + "/" + req_path;
      if (req_path[req_path.size() - 1] == '/') {
        if (listing) {
          serve_dir(resp, req, req_path);
          return;
        }
        req_path += "index.html";
      }

      serve_file(resp, req, req_path);
    }
  });
}